

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void do_gpr_st_memidx(DisasContext_conflict1 *s,TCGv_i64 source,TCGv_i64 tcg_addr,int size,
                     int memidx,_Bool iss_valid,uint iss_srt,_Bool iss_sf,_Bool iss_ar)

{
  if (3 < size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x35f,"size <= 3");
  }
  tcg_gen_qemu_st_i64_aarch64(s->uc->tcg_ctx,source,tcg_addr,(ulong)(uint)memidx,s->be_data + size);
  if (iss_valid) {
    if (s->insn_start == (TCGOp *)0x0) {
      __assert_fail("s->insn_start != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.h"
                    ,0x8d,"void disas_set_insn_syndrome(DisasContext *, uint32_t)");
    }
    s->insn_start->args[2] =
         (ulong)(((uint)iss_ar << 0xe |
                 (uint)iss_sf << 0xf | (iss_srt << 0x10 | size << 0x16) & 0xffc000) >> 0xe | 0xc00);
    s->insn_start = (TCGOp *)0x0;
  }
  return;
}

Assistant:

static void do_gpr_st_memidx(DisasContext *s, TCGv_i64 source,
                             TCGv_i64 tcg_addr, int size, int memidx,
                             bool iss_valid,
                             unsigned int iss_srt,
                             bool iss_sf, bool iss_ar)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    g_assert(size <= 3);
    tcg_gen_qemu_st_i64(tcg_ctx, source, tcg_addr, memidx, s->be_data + size);

    if (iss_valid) {
        uint32_t syn;

        syn = syn_data_abort_with_iss(0,
                                      size,
                                      false,
                                      iss_srt,
                                      iss_sf,
                                      iss_ar,
                                      0, 0, 0, 0, 0, false);
        disas_set_insn_syndrome(s, syn);
    }
}